

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aggregate_executor.hpp
# Opt level: O1

void duckdb::AggregateExecutor::
     BinaryUpdate<duckdb::ArgMinMaxState<duckdb::timestamp_t,int>,duckdb::timestamp_t,int,duckdb::ArgMinMaxBase<duckdb::LessThan,true>>
               (AggregateInputData *aggr_input_data,Vector *a,Vector *b,data_ptr_t state,idx_t count
               )

{
  int iVar1;
  sel_t *psVar2;
  sel_t *psVar3;
  idx_t iVar4;
  byte bVar5;
  idx_t iVar6;
  idx_t iVar7;
  UnifiedVectorFormat bdata;
  UnifiedVectorFormat adata;
  UnifiedVectorFormat local_b0;
  UnifiedVectorFormat local_68;
  
  UnifiedVectorFormat::UnifiedVectorFormat(&local_68);
  UnifiedVectorFormat::UnifiedVectorFormat(&local_b0);
  Vector::ToUnifiedFormat(a,count,&local_68);
  Vector::ToUnifiedFormat(b,count,&local_b0);
  if (local_68.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
      (unsigned_long *)0x0 &&
      local_b0.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
      (unsigned_long *)0x0) {
    if (count != 0) {
      psVar2 = (local_68.sel)->sel_vector;
      psVar3 = (local_b0.sel)->sel_vector;
      bVar5 = *state;
      iVar4 = 0;
      do {
        iVar6 = iVar4;
        if (psVar2 != (sel_t *)0x0) {
          iVar6 = (idx_t)psVar2[iVar4];
        }
        iVar7 = iVar4;
        if (psVar3 != (sel_t *)0x0) {
          iVar7 = (idx_t)psVar3[iVar4];
        }
        if ((bVar5 & 1) == 0) {
          *(undefined8 *)(state + 8) = *(undefined8 *)(local_68.data + iVar6 * 8);
          *(undefined4 *)(state + 0x10) = *(undefined4 *)(local_b0.data + iVar7 * 4);
          *state = '\x01';
          bVar5 = 1;
        }
        else {
          iVar1 = *(int *)(local_b0.data + iVar7 * 4);
          if (iVar1 < *(int *)(state + 0x10)) {
            *(undefined8 *)(state + 8) = *(undefined8 *)(local_68.data + iVar6 * 8);
            *(int *)(state + 0x10) = iVar1;
          }
        }
        iVar4 = iVar4 + 1;
      } while (count != iVar4);
    }
  }
  else if (count != 0) {
    psVar2 = (local_68.sel)->sel_vector;
    psVar3 = (local_b0.sel)->sel_vector;
    iVar4 = 0;
    do {
      iVar6 = iVar4;
      if (psVar2 != (sel_t *)0x0) {
        iVar6 = (idx_t)psVar2[iVar4];
      }
      iVar7 = iVar4;
      if (psVar3 != (sel_t *)0x0) {
        iVar7 = (idx_t)psVar3[iVar4];
      }
      if (((local_68.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
            (unsigned_long *)0x0) ||
          ((local_68.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask[iVar6 >> 6]
            >> (iVar6 & 0x3f) & 1) != 0)) &&
         ((local_b0.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
           (unsigned_long *)0x0 ||
          ((local_b0.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask[iVar7 >> 6]
            >> (iVar7 & 0x3f) & 1) != 0)))) {
        if (*state == '\0') {
          *(undefined8 *)(state + 8) = *(undefined8 *)(local_68.data + iVar6 * 8);
          *(undefined4 *)(state + 0x10) = *(undefined4 *)(local_b0.data + iVar7 * 4);
          *state = '\x01';
        }
        else {
          iVar1 = *(int *)(local_b0.data + iVar7 * 4);
          if (iVar1 < *(int *)(state + 0x10)) {
            *(undefined8 *)(state + 8) = *(undefined8 *)(local_68.data + iVar6 * 8);
            *(int *)(state + 0x10) = iVar1;
          }
        }
      }
      iVar4 = iVar4 + 1;
    } while (count != iVar4);
  }
  if (local_b0.owned_sel.selection_data.internal.
      super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_b0.owned_sel.selection_data.internal.
               super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  if (local_b0.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
      super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_b0.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
               super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  if (local_68.owned_sel.selection_data.internal.
      super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_68.owned_sel.selection_data.internal.
               super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  if (local_68.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
      super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_68.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
               super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  return;
}

Assistant:

static void BinaryUpdate(AggregateInputData &aggr_input_data, Vector &a, Vector &b, data_ptr_t state, idx_t count) {
		UnifiedVectorFormat adata, bdata;

		a.ToUnifiedFormat(count, adata);
		b.ToUnifiedFormat(count, bdata);

		BinaryUpdateLoop<STATE_TYPE, A_TYPE, B_TYPE, OP>(
		    UnifiedVectorFormat::GetData<A_TYPE>(adata), aggr_input_data, UnifiedVectorFormat::GetData<B_TYPE>(bdata),
		    (STATE_TYPE *)state, count, *adata.sel, *bdata.sel, adata.validity, bdata.validity);
	}